

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::Mine::ClearWireVertices(Mine *this,KUINT16 Index)

{
  iterator iVar1;
  
  iVar1 = getWire(this,Index);
  std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::clear
            ((vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_> *)
             &iVar1._M_node[1]._M_parent);
  return;
}

Assistant:

void Mine::ClearWireVertices(KUINT16 Index) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.clear();
}